

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall
google::protobuf::EnumValueDescriptorProto::ByteSizeLong(EnumValueDescriptorProto *this)

{
  long lVar1;
  anon_union_32_1_493b367e_for_EnumValueDescriptorProto_3 aVar2;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  
  aVar2 = this->field_0;
  if (((undefined1  [32])aVar2 & (undefined1  [32])0x7) == (undefined1  [32])0x0) {
    sVar5 = 0;
  }
  else {
    if (((undefined1  [32])aVar2 & (undefined1  [32])0x1) == (undefined1  [32])0x0) {
      sVar5 = 0;
    }
    else {
      sVar5 = internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
                        );
      sVar5 = sVar5 + 1;
    }
    if (((undefined1  [32])aVar2 & (undefined1  [32])0x2) != (undefined1  [32])0x0) {
      sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::EnumValueOptions>
                        ((this->field_0)._impl_.options_);
      sVar5 = sVar5 + sVar3 + 1;
    }
    if (((undefined1  [32])aVar2 & (undefined1  [32])0x4) != (undefined1  [32])0x0) {
      uVar4 = (long)(this->field_0)._impl_.number_ | 1;
      lVar1 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar1 * 9 + 0x89U >> 6);
    }
  }
  sVar5 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar5,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t EnumValueDescriptorProto::ByteSizeLong() const {
  const EnumValueDescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.EnumValueDescriptorProto)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    // optional string name = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_name());
    }
    // optional .google.protobuf.EnumValueOptions options = 3;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.options_);
    }
    // optional int32 number = 2;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_number());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}